

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> __thiscall
llvm::StringMap<llvm::cl::Option*,llvm::MallocAllocator>::try_emplace<llvm::cl::Option*>
          (StringMap<llvm::cl::Option*,llvm::MallocAllocator> *this,StringRef Key,Option **Args)

{
  StringMapEntryBase *pSVar1;
  StringMapEntryBase *pSVar2;
  StringMapEntry<llvm::cl::Option_*> *pSVar3;
  Option **in_R8;
  StringRef Key_00;
  pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> pVar4;
  bool local_91;
  StringMapIterator<llvm::cl::Option_*> local_90;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *local_88;
  char *local_80;
  bool local_61;
  StringMapIterator<llvm::cl::Option_*> local_60;
  long *local_58;
  StringMapEntryBase **Bucket;
  char *local_48;
  uint local_3c;
  MallocAllocator *pMStack_38;
  uint BucketNo;
  Option **Args_local;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this_local;
  StringRef Key_local;
  undefined1 local_10;
  
  local_48 = (char *)Key.Length;
  Bucket = (StringMapEntryBase **)Key.Data;
  pMStack_38 = (MallocAllocator *)Args;
  Args_local = (Option **)this;
  this_local = (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)Bucket;
  Key_local.Data = local_48;
  local_3c = StringMapImpl::LookupBucketFor((StringMapImpl *)this,Key);
  local_58 = (long *)(*(long *)this + (ulong)local_3c * 8);
  if (*local_58 != 0) {
    pSVar1 = (StringMapEntryBase *)*local_58;
    pSVar2 = StringMapImpl::getTombstoneVal();
    if (pSVar1 != pSVar2) {
      StringMapIterator<llvm::cl::Option_*>::StringMapIterator
                (&local_60,(StringMapEntryBase **)(*(long *)this + (ulong)local_3c * 8),false);
      local_61 = false;
      pVar4 = std::make_pair<llvm::StringMapIterator<llvm::cl::Option*>,bool>(&local_60,&local_61);
      local_10 = pVar4.second;
      goto LAB_0018a236;
    }
  }
  pSVar1 = (StringMapEntryBase *)*local_58;
  pSVar2 = StringMapImpl::getTombstoneVal();
  if (pSVar1 == pSVar2) {
    *(int *)(this + 0x10) = *(int *)(this + 0x10) + -1;
  }
  local_88 = this_local;
  local_80 = Key_local.Data;
  Key_00.Length = this + 0x18;
  Key_00.Data = Key_local.Data;
  pSVar3 = StringMapEntry<llvm::cl::Option*>::Create<llvm::MallocAllocator,llvm::cl::Option*>
                     ((StringMapEntry<llvm::cl::Option*> *)this_local,Key_00,pMStack_38,in_R8);
  *local_58 = (long)pSVar3;
  *(int *)(this + 0xc) = *(int *)(this + 0xc) + 1;
  if (*(uint *)(this + 8) < (uint)(*(int *)(this + 0xc) + *(int *)(this + 0x10))) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<llvm::cl::Option *>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = llvm::cl::Option *, AllocatorTy = llvm::MallocAllocator, ArgsTy = <llvm::cl::Option *>]"
                 );
  }
  local_3c = StringMapImpl::RehashTable((StringMapImpl *)this,local_3c);
  StringMapIterator<llvm::cl::Option_*>::StringMapIterator
            (&local_90,(StringMapEntryBase **)(*(long *)this + (ulong)local_3c * 8),false);
  local_91 = true;
  pVar4 = std::make_pair<llvm::StringMapIterator<llvm::cl::Option*>,bool>(&local_90,&local_91);
  local_10 = pVar4.second;
LAB_0018a236:
  Key_local.Length =
       (size_t)pVar4.first.
               super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
               .Ptr;
  pVar4.second = (bool)local_10;
  pVar4.first.
  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
          )(StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
            )Key_local.Length;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }